

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.hpp
# Opt level: O2

Function * LLVMBC::dyn_cast<LLVMBC::Function>(Value *value)

{
  ValueKind VVar1;
  Function *this;
  Function *pFVar2;
  
  if (value != (Value *)0x0) {
    this = (Function *)Internal::resolve_proxy(value);
    VVar1 = Value::get_value_kind((Value *)this);
    pFVar2 = (Function *)0x0;
    if (VVar1 == Function) {
      pFVar2 = this;
    }
    return pFVar2;
  }
  return (Function *)0x0;
}

Assistant:

inline T *dyn_cast(Value *value)
{
	if (!value)
		return nullptr;

	if (T::get_value_kind() != ValueKind::Proxy)
		value = Internal::resolve_proxy(value);

	if (T::is_base_of_value_kind(value->get_value_kind()))
		return static_cast<T *>(value);
	else
		return nullptr;
}